

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::Incomplete2DFormatCase::Incomplete2DFormatCase
          (Incomplete2DFormatCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,IVec2 *size,deUint32 format,deUint32 invalidFormat,int invalidLevelNdx)

{
  int i;
  long lVar1;
  
  tcu::TestCase::TestCase((TestCase *)this,testCtx,name,description);
  (this->super_Tex2DCompletenessCase).m_testCtx = testCtx;
  (this->super_Tex2DCompletenessCase).m_renderCtx = renderCtx;
  (this->super_Tex2DCompletenessCase).m_compareColor.m_value = 0xff000000;
  (this->super_Tex2DCompletenessCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_0078c390;
  *(int *)&(this->super_Tex2DCompletenessCase).field_0x84 = invalidLevelNdx;
  this->m_format = format;
  this->m_invalidFormat = invalidFormat;
  lVar1 = 0;
  do {
    (this->m_size).m_data[lVar1] = size->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return;
}

Assistant:

Incomplete2DFormatCase::Incomplete2DFormatCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, IVec2 size, deUint32 format, deUint32 invalidFormat, int invalidLevelNdx)
	: Tex2DCompletenessCase		(testCtx, renderCtx, name, description)
	, m_invalidLevelNdx			(invalidLevelNdx)
	, m_format					(format)
	, m_invalidFormat			(invalidFormat)
	, m_size					(size)
{
}